

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdLut.c
# Opt level: O2

void Sbd_ProblemCollectSolution(int nStrs,Sbd_Str_t *pStr0,Vec_Int_t *vLits)

{
  uint uVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  Sbd_Str_t *pSVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  int iVar14;
  
  pSVar5 = pStr0 + nStrs;
  iVar14 = 0;
  do {
    if (pSVar5 <= pStr0) {
      if (iVar14 == vLits->nSize) {
        return;
      }
      __assert_fail("iLit == Vec_IntSize(vLits)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdLut.c"
                    ,0xad,"void Sbd_ProblemCollectSolution(int, Sbd_Str_t *, Vec_Int_t *)");
    }
    pStr0->Res = 0;
    if (pStr0->fLut == 0) {
      iVar10 = 0;
      for (lVar13 = 0; lVar13 < pStr0->nVarIns; lVar13 = lVar13 + 1) {
        iVar3 = Vec_IntEntry(vLits,iVar14 + (int)lVar13);
        iVar3 = Abc_LitIsCompl(iVar3);
        if (iVar3 == 0) {
          pStr0->Res = (long)pStr0->VarIns[lVar13];
          iVar10 = iVar10 + 1;
        }
      }
      if (iVar10 != 1) {
        __assert_fail("nIters == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdLut.c"
                      ,0xaa,"void Sbd_ProblemCollectSolution(int, Sbd_Str_t *, Vec_Int_t *)");
      }
      iVar14 = iVar14 + (int)lVar13;
    }
    else {
      bVar2 = (byte)pStr0->nVarIns & 0x1f;
      uVar7 = 0;
      uVar9 = (ulong)(uint)(1 << bVar2);
      if (1 << bVar2 < 1) {
        uVar9 = uVar7;
      }
      while( true ) {
        iVar10 = (int)uVar7;
        if ((int)uVar9 == iVar10) break;
        iVar3 = Vec_IntEntry(vLits,iVar10 + iVar14);
        iVar3 = Abc_LitIsCompl(iVar3);
        if (iVar3 == 0) {
          *(ulong *)(pStr0->VarIns + (uVar7 >> 6) * 2 + 10) =
               *(ulong *)(pStr0->VarIns + (uVar7 >> 6) * 2 + 10) | 1L << ((byte)uVar7 & 0x3f);
        }
        uVar7 = (ulong)(iVar10 + 1);
      }
      uVar1 = pStr0->nVarIns;
      if ((int)uVar1 < 0) {
        __assert_fail("nVars >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                      ,0x489,"word Abc_Tt6Stretch(word, int)");
      }
      uVar8 = uVar1;
      if (uVar1 < 3) {
        uVar8 = 3;
      }
      uVar6 = uVar8;
      if (uVar8 == 3) {
        uVar6 = 4;
      }
      uVar4 = uVar6;
      if (uVar6 == 4) {
        uVar4 = 5;
      }
      if (1 < uVar4 - 5) {
        __assert_fail("nVars == 6",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                      ,0x496,"word Abc_Tt6Stretch(word, int)");
      }
      uVar11 = (uint)pStr0->Res;
      uVar12 = -(uVar11 & 1);
      if (uVar1 != 0) {
        uVar12 = uVar11;
      }
      uVar12 = (uVar12 & 3) * 5;
      if (1 < uVar1) {
        uVar12 = uVar11;
      }
      uVar9 = (ulong)(uVar12 & 0xf) * 0x11;
      if (2 < uVar1) {
        uVar9 = pStr0->Res;
      }
      uVar7 = (uVar9 & 0xff) * 0x101;
      if (uVar8 != 3) {
        uVar7 = uVar9;
      }
      uVar9 = (uVar7 & 0xffff) * 0x10001;
      if (uVar6 != 4) {
        uVar9 = uVar7;
      }
      uVar7 = (uVar9 & 0xffffffff) * 0x100000001;
      if (uVar4 != 5) {
        uVar7 = uVar9;
      }
      pStr0->Res = uVar7;
      iVar14 = iVar10 + iVar14;
    }
    pStr0 = pStr0 + 1;
  } while( true );
}

Assistant:

void Sbd_ProblemCollectSolution( int nStrs, Sbd_Str_t * pStr0, Vec_Int_t * vLits )
{
    Sbd_Str_t * pStr;
    int m, nIters, iLit = 0;
    for ( pStr = pStr0; pStr < pStr0 + nStrs; pStr++ )
    {
        pStr->Res = 0;
        if ( pStr->fLut )
        {
            nIters = 1 << pStr->nVarIns;
            for ( m = 0; m < nIters; m++, iLit++ )
                if ( !Abc_LitIsCompl(Vec_IntEntry(vLits, iLit)) )
                    Abc_TtSetBit( &pStr->Res, m );
            pStr->Res = Abc_Tt6Stretch( pStr->Res, pStr->nVarIns );
        }
        else
        {
            nIters = 0;
            for ( m = 0; m < pStr->nVarIns; m++, iLit++ )
                if ( !Abc_LitIsCompl(Vec_IntEntry(vLits, iLit)) )
                {
                    pStr->Res = pStr->VarIns[m];
                    nIters++;
                }
            assert( nIters == 1 );
        }
    }
    assert( iLit == Vec_IntSize(vLits) );
}